

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O1

void __thiscall duckdb::MetadataManager::Read(MetadataManager *this,ReadStream *source)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  element_type *peVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  element_type *peVar9;
  unsigned_long value;
  MetadataBlock local_98;
  MetadataBlock local_68;
  
  (**source->_vptr_ReadStream)(source,&local_98,8);
  peVar4 = local_98.block.internal.
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_98.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    peVar9 = (element_type *)0x0;
    do {
      MetadataBlock::Read(&local_98,source);
      uVar1 = (this->blocks)._M_h._M_bucket_count;
      uVar7 = (ulong)local_98.block_id % uVar1;
      p_Var2 = (this->blocks)._M_h._M_buckets[uVar7];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var2, p_Var8 = p_Var2->_M_nxt,
         (_Hash_node_base *)local_98.block_id != p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var6 = p_Var8->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar7) ||
             (p_Var5 = p_Var8, p_Var8 = p_Var6,
             (_Hash_node_base *)local_98.block_id == p_Var6[1]._M_nxt)) goto LAB_005b76f2;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_005b76f2:
      if (p_Var5 == (__node_base_ptr)0x0) {
        p_Var6 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var6 = p_Var5->_M_nxt;
      }
      if (p_Var6 == (_Hash_node_base *)0x0) {
        local_68.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_98.block.internal.
                 super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_68.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_98.block.internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_98.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_98.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_68.block_id = local_98.block_id;
        local_68.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_68.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_68.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        AddAndRegisterBlock(this,&local_68);
        if ((_Hash_node_base *)
            local_68.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (_Hash_node_base *)0x0) {
          operator_delete(local_68.free_blocks.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_68.block.internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.block.internal.
                     super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
      }
      else {
        p_Var3 = p_Var6[5]._M_nxt;
        p_Var6[5]._M_nxt =
             (_Hash_node_base *)
             local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        p_Var6[6]._M_nxt =
             (_Hash_node_base *)
             local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        p_Var6[7]._M_nxt =
             (_Hash_node_base *)
             local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (p_Var3 != (_Hash_node_base *)0x0) {
          operator_delete(p_Var3);
        }
      }
      if ((_Hash_node_base *)
          local_98.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (_Hash_node_base *)0x0) {
        operator_delete(local_98.free_blocks.
                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_98.block.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.block.internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      peVar9 = (element_type *)
               ((long)&(peVar9->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.
                       internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 1);
    } while (peVar9 != peVar4);
  }
  return;
}

Assistant:

void MetadataManager::Read(ReadStream &source) {
	auto block_count = source.Read<uint64_t>();
	for (idx_t i = 0; i < block_count; i++) {
		auto block = MetadataBlock::Read(source);
		auto entry = blocks.find(block.block_id);
		if (entry == blocks.end()) {
			// block does not exist yet
			AddAndRegisterBlock(std::move(block));
		} else {
			// block was already created - only copy over the free list
			entry->second.free_blocks = std::move(block.free_blocks);
		}
	}
}